

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O0

long hidden_gold(void)

{
  long lVar1;
  obj *local_18;
  obj *obj;
  long value;
  
  obj = (obj *)0x0;
  for (local_18 = invent; local_18 != (obj *)0x0; local_18 = local_18->nobj) {
    if (local_18->cobj != (obj *)0x0) {
      lVar1 = contained_gold(local_18);
      obj = (obj *)((long)obj->oextra + lVar1 + -100);
    }
  }
  return (long)obj;
}

Assistant:

long hidden_gold(void)
{
	long value = 0L;
	struct obj *obj;

	for (obj = invent; obj; obj = obj->nobj)
	    if (Has_contents(obj))
		value += contained_gold(obj);
	/* unknown gold stuck inside statues may cause some consternation... */

	return value;
}